

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_sgemm_pack8to1_int8.h
# Opt level: O1

void ncnn::im2col_sgemm_pack8to1_int8_sse(Mat *bottom_im2col,Mat *top_blob,Mat *kernel,Option *opt)

{
  uint uVar1;
  uint _h;
  int iVar2;
  size_t sVar3;
  size_t sVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  int *piVar17;
  int iVar18;
  int iVar19;
  long lVar20;
  void *pvVar21;
  void *pvVar22;
  int nn_2;
  ulong uVar23;
  ulong uVar24;
  uint uVar25;
  undefined1 (*pauVar26) [16];
  undefined8 *puVar27;
  undefined4 *puVar28;
  ulong uVar29;
  undefined4 *puVar30;
  int nn;
  undefined1 (*pauVar31) [16];
  undefined8 *puVar32;
  int iVar33;
  undefined4 *puVar34;
  ulong uVar35;
  long lVar36;
  uint uVar37;
  uint uVar38;
  undefined4 *puVar39;
  undefined1 auVar40 [16];
  undefined1 auVar41 [64];
  undefined1 auVar42 [16];
  undefined1 auVar43 [64];
  undefined1 auVar44 [64];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [64];
  int nn_1;
  Mat local_178;
  Mat *local_130;
  Mat *local_128;
  long local_120;
  ulong local_118;
  void *local_110;
  undefined1 local_108 [16];
  undefined1 local_f8 [16];
  undefined1 local_e8 [16];
  undefined1 local_d8 [16];
  void *local_c8;
  ulong local_c0;
  long local_b8;
  void *local_b0;
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  
  iVar18 = cpu_support_x86_avx2();
  if (iVar18 != 0) {
    im2col_sgemm_pack8to1_int8_sse_avx2(bottom_im2col,top_blob,kernel,opt);
    return;
  }
  iVar18 = cpu_support_x86_xop();
  if (iVar18 == 0) {
    uVar1 = bottom_im2col->w;
    uVar23 = (ulong)(int)uVar1;
    iVar18 = bottom_im2col->h;
    _h = bottom_im2col->c;
    iVar2 = top_blob->c;
    local_178.cstep = 0;
    local_178.elemsize = 0;
    local_178.elempack = 0;
    local_178.data = (void *)0x0;
    local_178.refcount._0_4_ = 0;
    local_178.refcount._4_4_ = 0;
    local_178.h = 0;
    local_178.d = 0;
    local_178.c = 0;
    local_178.allocator = (Allocator *)0x0;
    local_178.dims = 0;
    local_178.w = 0;
    uVar25 = (uVar1 & 1) + (uVar1 >> 1);
    if ((long)uVar23 < 2) {
      uVar25 = uVar1;
    }
    local_128 = top_blob;
    Mat::create(&local_178,iVar18 << (1 < (long)uVar23),_h,uVar25,8,8,opt->workspace_allocator);
    if (0 < (int)uVar1 >> 1) {
      lVar20 = 0;
      uVar24 = 0;
      do {
        if (0 < (int)_h) {
          pauVar26 = (undefined1 (*) [16])
                     (local_178.cstep * uVar24 * local_178.elemsize + (long)local_178.data);
          uVar29 = 0;
          do {
            if (0 < iVar18) {
              pauVar31 = (undefined1 (*) [16])
                         ((long)bottom_im2col->data +
                         bottom_im2col->cstep * bottom_im2col->elemsize * uVar29 + lVar20);
              iVar33 = iVar18;
              do {
                *pauVar26 = *pauVar31;
                pauVar26 = pauVar26 + 1;
                pauVar31 = (undefined1 (*) [16])(*pauVar31 + uVar23 * 8);
                iVar33 = iVar33 + -1;
              } while (iVar33 != 0);
            }
            uVar29 = uVar29 + 1;
          } while (uVar29 != _h);
        }
        uVar24 = uVar24 + 1;
        lVar20 = lVar20 + 0x10;
      } while (uVar24 != (uint)((int)uVar1 >> 1));
    }
    uVar24 = uVar23 & 0xfffffffffffffffe;
    if ((uint)uVar24 != uVar1) {
      pvVar21 = (void *)(uVar24 * 8 + (long)bottom_im2col->data);
      do {
        if (0 < (int)_h) {
          uVar25 = ((uint)(uVar24 >> 0x1f) & 1) + (int)uVar24;
          puVar27 = (undefined8 *)
                    ((long)(int)(((int)uVar25 >> 1) + ((int)uVar24 - (uVar25 & 0xfffffffe))) *
                     local_178.cstep * local_178.elemsize + (long)local_178.data);
          uVar29 = 0;
          do {
            if (0 < iVar18) {
              puVar32 = (undefined8 *)
                        (bottom_im2col->cstep * bottom_im2col->elemsize * uVar29 + (long)pvVar21);
              iVar33 = iVar18;
              do {
                *puVar27 = *puVar32;
                puVar27 = puVar27 + 1;
                puVar32 = puVar32 + uVar23;
                iVar33 = iVar33 + -1;
              } while (iVar33 != 0);
            }
            uVar29 = uVar29 + 1;
          } while (uVar29 != _h);
        }
        uVar24 = uVar24 + 1;
        pvVar21 = (void *)((long)pvVar21 + 8);
      } while ((long)uVar24 < (long)uVar23);
    }
    if (0 < iVar2 >> 2) {
      local_b0 = local_128->data;
      local_b8 = local_128->cstep * local_128->elemsize;
      local_110 = local_178.data;
      local_c8 = kernel->data;
      iVar33 = _h * iVar18;
      local_120 = kernel->cstep * kernel->elemsize;
      local_c0 = (ulong)(uint)(iVar2 >> 2);
      uVar24 = 0;
      pvVar21 = local_c8;
      do {
        local_118 = uVar24;
        puVar39 = (undefined4 *)(local_118 * 4 * local_b8 + (long)local_b0);
        puVar28 = (undefined4 *)((local_118 * 4 + 1) * local_b8 + (long)local_b0);
        puVar34 = (undefined4 *)((local_118 * 4 + 2) * local_b8 + (long)local_b0);
        puVar30 = (undefined4 *)((local_118 * 4 + 3) * local_b8 + (long)local_b0);
        if ((int)uVar1 < 2) {
          uVar24 = 0;
        }
        else {
          uVar29 = 0;
          pvVar22 = local_178.data;
          do {
            if (iVar33 < 1) {
              auVar46 = (undefined1  [16])0x0;
              local_d8 = (undefined1  [16])0x0;
              local_108 = (undefined1  [16])0x0;
              auVar42 = (undefined1  [16])0x0;
              auVar45 = (undefined1  [16])0x0;
              local_e8 = (undefined1  [16])0x0;
              local_f8 = (undefined1  [16])0x0;
              auVar40 = (undefined1  [16])0x0;
            }
            else {
              auVar47 = ZEXT1664((undefined1  [16])0x0);
              lVar20 = 0;
              local_f8 = (undefined1  [16])0x0;
              local_e8 = (undefined1  [16])0x0;
              local_108 = (undefined1  [16])0x0;
              local_d8 = (undefined1  [16])0x0;
              iVar19 = iVar33;
              auVar45 = ZEXT816(0) << 0x40;
              auVar46 = ZEXT816(0) << 0x40;
              auVar42 = ZEXT816(0) << 0x40;
              do {
                local_48 = auVar42;
                local_98 = auVar46;
                local_a8 = auVar45;
                auVar40 = *(undefined1 (*) [16])((long)pvVar22 + lVar20);
                auVar45 = vpcmpgtb_avx((undefined1  [16])0x0,auVar40);
                auVar15 = vpunpcklbw_avx(auVar40,auVar45);
                auVar14 = vpunpckhbw_avx(auVar40,auVar45);
                auVar40 = *(undefined1 (*) [16])((long)pvVar21 + lVar20 * 2);
                auVar45 = *(undefined1 (*) [16])((long)pvVar21 + lVar20 * 2 + 0x10);
                auVar42 = vpcmpgtb_avx((undefined1  [16])0x0,auVar40);
                auVar46 = vpcmpgtb_avx((undefined1  [16])0x0,auVar45);
                auVar16 = vpunpcklbw_avx(auVar40,auVar42);
                auVar40 = vpunpckhbw_avx(auVar40,auVar42);
                auVar42 = vpunpcklbw_avx(auVar45,auVar46);
                auVar45 = vpunpckhbw_avx(auVar45,auVar46);
                auVar10 = vpmullw_avx(auVar16,auVar15);
                auVar5 = vpmulhw_avx(auVar15,auVar16);
                auVar11 = vpmullw_avx(auVar40,auVar15);
                auVar6 = vpmulhw_avx(auVar15,auVar40);
                auVar12 = vpmullw_avx(auVar42,auVar15);
                auVar7 = vpmulhw_avx(auVar15,auVar42);
                auVar13 = vpmullw_avx(auVar45,auVar15);
                auVar15 = vpmulhw_avx(auVar15,auVar45);
                local_58 = vpmullw_avx(auVar16,auVar14);
                auVar16 = vpmulhw_avx(auVar14,auVar16);
                local_68 = vpmullw_avx(auVar40,auVar14);
                auVar8 = vpmulhw_avx(auVar14,auVar40);
                local_78 = vpmullw_avx(auVar42,auVar14);
                auVar9 = vpmulhw_avx(auVar14,auVar42);
                local_88 = vpmullw_avx(auVar45,auVar14);
                auVar14 = vpmulhw_avx(auVar14,auVar45);
                auVar40 = vpunpcklwd_avx(auVar10,auVar5);
                auVar40 = vpaddd_avx(auVar47._0_16_,auVar40);
                auVar45 = vpunpcklwd_avx(auVar11,auVar6);
                auVar45 = vpaddd_avx(auVar45,local_f8);
                auVar42 = vpunpcklwd_avx(auVar12,auVar7);
                auVar42 = vpaddd_avx(auVar42,local_e8);
                auVar46 = vpunpcklwd_avx(auVar13,auVar15);
                auVar46 = vpaddd_avx(auVar46,local_a8);
                auVar5 = vpunpckhwd_avx(auVar10,auVar5);
                auVar40 = vpaddd_avx(auVar40,auVar5);
                auVar47 = ZEXT1664(auVar40);
                auVar5 = vpunpckhwd_avx(auVar11,auVar6);
                local_f8 = vpaddd_avx(auVar45,auVar5);
                auVar45 = vpunpckhwd_avx(auVar12,auVar7);
                local_e8 = vpaddd_avx(auVar42,auVar45);
                auVar45 = vpunpckhwd_avx(auVar13,auVar15);
                auVar45 = vpaddd_avx(auVar46,auVar45);
                auVar42 = vpunpcklwd_avx(local_58,auVar16);
                auVar42 = vpaddd_avx(auVar42,local_48);
                auVar46 = vpunpcklwd_avx(local_68,auVar8);
                auVar46 = vpaddd_avx(auVar46,local_108);
                auVar5 = vpunpcklwd_avx(local_78,auVar9);
                auVar5 = vpaddd_avx(auVar5,local_d8);
                auVar6 = vpunpcklwd_avx(local_88,auVar14);
                auVar6 = vpaddd_avx(auVar6,local_98);
                auVar7 = vpunpckhwd_avx(local_58,auVar16);
                auVar42 = vpaddd_avx(auVar42,auVar7);
                auVar7 = vpunpckhwd_avx(local_68,auVar8);
                local_108 = vpaddd_avx(auVar46,auVar7);
                auVar46 = vpunpckhwd_avx(local_78,auVar9);
                local_d8 = vpaddd_avx(auVar5,auVar46);
                auVar46 = vpunpckhwd_avx(local_88,auVar14);
                auVar46 = vpaddd_avx(auVar6,auVar46);
                lVar20 = lVar20 + 0x10;
                iVar19 = iVar19 + -1;
              } while (iVar19 != 0);
            }
            auVar6 = vpunpckldq_avx(auVar40,local_f8);
            auVar7 = vpunpckldq_avx(local_e8,auVar45);
            auVar5 = vpunpckhdq_avx(auVar40,local_f8);
            auVar45 = vpunpckhdq_avx(local_e8,auVar45);
            auVar15 = vpunpckldq_avx(auVar42,local_108);
            auVar16 = vpunpckldq_avx(local_d8,auVar46);
            auVar42 = vpunpckhdq_avx(auVar42,local_108);
            auVar46 = vpunpckhdq_avx(local_d8,auVar46);
            auVar8 = vpunpcklqdq_avx(auVar6,auVar7);
            auVar40 = vpunpckhqdq_avx(auVar6,auVar7);
            auVar40 = vpaddd_avx(auVar8,auVar40);
            auVar6 = vpunpcklqdq_avx(auVar5,auVar45);
            auVar45 = vpunpckhqdq_avx(auVar5,auVar45);
            auVar45 = vpaddd_avx(auVar45,auVar6);
            auVar40 = vpaddd_avx(auVar40,auVar45);
            auVar5 = vpunpcklqdq_avx(auVar15,auVar16);
            auVar45 = vpunpckhqdq_avx(auVar15,auVar16);
            auVar45 = vpaddd_avx(auVar5,auVar45);
            auVar5 = vpunpcklqdq_avx(auVar42,auVar46);
            *puVar39 = auVar40._0_4_;
            *puVar28 = auVar40._4_4_;
            *puVar34 = auVar40._8_4_;
            *puVar30 = auVar40._12_4_;
            auVar40 = vpunpckhqdq_avx(auVar42,auVar46);
            auVar40 = vpaddd_avx(auVar40,auVar5);
            auVar40 = vpaddd_avx(auVar45,auVar40);
            puVar39[1] = auVar40._0_4_;
            puVar28[1] = auVar40._4_4_;
            puVar34[1] = auVar40._8_4_;
            puVar30[1] = auVar40._12_4_;
            puVar39 = puVar39 + 2;
            puVar28 = puVar28 + 2;
            puVar34 = puVar34 + 2;
            puVar30 = puVar30 + 2;
            uVar24 = uVar29 + 2;
            lVar20 = uVar29 + 3;
            pvVar22 = (void *)((long)pvVar22 + local_178.cstep * local_178.elemsize);
            uVar29 = uVar24;
          } while (lVar20 < (long)uVar23);
        }
        if ((int)uVar24 < (int)uVar1) {
          do {
            if ((int)(_h * iVar18) < 1) {
              auVar46 = (undefined1  [16])0x0;
              auVar42 = (undefined1  [16])0x0;
              auVar45 = (undefined1  [16])0x0;
              auVar40 = (undefined1  [16])0x0;
            }
            else {
              auVar47 = ZEXT1664((undefined1  [16])0x0);
              lVar20 = 0;
              auVar44 = ZEXT1664((undefined1  [16])0x0);
              auVar43 = ZEXT1664((undefined1  [16])0x0);
              auVar41 = ZEXT1664((undefined1  [16])0x0);
              pauVar26 = (undefined1 (*) [16])(local_120 * local_118 + (long)local_c8);
              do {
                auVar40._8_8_ = 0;
                auVar40._0_8_ =
                     *(ulong *)((long)local_178.data +
                               lVar20 * 8 +
                               (ulong)(((uint)uVar24 & 1) + ((uint)(uVar24 >> 1) & 0x7fffffff)) *
                               local_178.cstep * local_178.elemsize);
                auVar5 = vpmovsxbw_avx(auVar40);
                auVar40 = *pauVar26;
                auVar45 = pauVar26[1];
                auVar42 = vpcmpgtb_avx((undefined1  [16])0x0,auVar40);
                auVar46 = vpcmpgtb_avx((undefined1  [16])0x0,auVar45);
                auVar6 = vpunpcklbw_avx(auVar40,auVar42);
                auVar40 = vpunpckhbw_avx(auVar40,auVar42);
                auVar42 = vpunpcklbw_avx(auVar45,auVar46);
                auVar45 = vpunpckhbw_avx(auVar45,auVar46);
                auVar16 = vpmullw_avx(auVar6,auVar5);
                auVar6 = vpmulhw_avx(auVar6,auVar5);
                auVar8 = vpmullw_avx(auVar40,auVar5);
                auVar7 = vpmulhw_avx(auVar5,auVar40);
                auVar9 = vpmullw_avx(auVar42,auVar5);
                auVar15 = vpmulhw_avx(auVar5,auVar42);
                auVar14 = vpmullw_avx(auVar45,auVar5);
                auVar5 = vpmulhw_avx(auVar5,auVar45);
                auVar40 = vpunpcklwd_avx(auVar16,auVar6);
                auVar40 = vpaddd_avx(auVar47._0_16_,auVar40);
                auVar45 = vpunpcklwd_avx(auVar8,auVar7);
                auVar45 = vpaddd_avx(auVar44._0_16_,auVar45);
                auVar42 = vpunpcklwd_avx(auVar9,auVar15);
                auVar42 = vpaddd_avx(auVar43._0_16_,auVar42);
                auVar46 = vpunpcklwd_avx(auVar14,auVar5);
                auVar46 = vpaddd_avx(auVar41._0_16_,auVar46);
                auVar6 = vpunpckhwd_avx(auVar16,auVar6);
                auVar40 = vpaddd_avx(auVar40,auVar6);
                auVar47 = ZEXT1664(auVar40);
                auVar6 = vpunpckhwd_avx(auVar8,auVar7);
                auVar45 = vpaddd_avx(auVar45,auVar6);
                auVar44 = ZEXT1664(auVar45);
                auVar6 = vpunpckhwd_avx(auVar9,auVar15);
                auVar42 = vpaddd_avx(auVar42,auVar6);
                auVar43 = ZEXT1664(auVar42);
                auVar5 = vpunpckhwd_avx(auVar14,auVar5);
                auVar46 = vpaddd_avx(auVar46,auVar5);
                auVar41 = ZEXT1664(auVar46);
                pauVar26 = pauVar26 + 2;
                lVar20 = lVar20 + 1;
              } while (iVar33 != (int)lVar20);
            }
            auVar5 = vpunpckldq_avx(auVar40,auVar45);
            auVar6 = vpunpckldq_avx(auVar42,auVar46);
            auVar45 = vpunpckhdq_avx(auVar40,auVar45);
            auVar42 = vpunpckhdq_avx(auVar42,auVar46);
            auVar46 = vpunpcklqdq_avx(auVar5,auVar6);
            auVar40 = vpunpckhqdq_avx(auVar5,auVar6);
            auVar40 = vpaddd_avx(auVar46,auVar40);
            auVar46 = vpunpcklqdq_avx(auVar45,auVar42);
            auVar45 = vpunpckhqdq_avx(auVar45,auVar42);
            auVar45 = vpaddd_avx(auVar45,auVar46);
            auVar40 = vpaddd_avx(auVar40,auVar45);
            *puVar39 = auVar40._0_4_;
            *puVar28 = auVar40._4_4_;
            *puVar34 = auVar40._8_4_;
            *puVar30 = auVar40._12_4_;
            puVar39 = puVar39 + 1;
            puVar28 = puVar28 + 1;
            puVar34 = puVar34 + 1;
            puVar30 = puVar30 + 1;
            uVar25 = (uint)uVar24 + 1;
            uVar24 = (ulong)uVar25;
          } while (uVar25 != uVar1);
        }
        pvVar21 = (void *)((long)pvVar21 + local_120);
        uVar24 = local_118 + 1;
      } while (local_118 + 1 != local_c0);
    }
    uVar24 = (long)iVar2 & 0xfffffffffffffffc;
    if ((int)uVar24 != iVar2) {
      pvVar21 = local_128->data;
      sVar3 = local_128->cstep;
      sVar4 = local_128->elemsize;
      pvVar22 = kernel->data;
      lVar20 = kernel->cstep * kernel->elemsize;
      iVar33 = _h * iVar18;
      do {
        puVar27 = (undefined8 *)(sVar3 * sVar4 * uVar24 + (long)pvVar21);
        uVar25 = (uint)uVar24;
        if ((int)uVar1 < 2) {
          uVar29 = 0;
        }
        else {
          uVar37 = uVar25 + 3;
          if (-1 < (int)uVar25) {
            uVar37 = uVar25;
          }
          uVar35 = 0;
          do {
            if (iVar33 < 1) {
              auVar40 = (undefined1  [16])0x0;
              auVar45 = (undefined1  [16])0x0;
            }
            else {
              pauVar26 = (undefined1 (*) [16])
                         ((uVar35 >> 1) * local_178.cstep * local_178.elemsize +
                         (long)local_178.data);
              auVar47 = ZEXT1664((undefined1  [16])0x0);
              lVar36 = 0;
              auVar41 = ZEXT1664((undefined1  [16])0x0);
              auVar43 = ZEXT1664((undefined1  [16])0x0);
              auVar44 = ZEXT1664((undefined1  [16])0x0);
              do {
                auVar40 = *pauVar26;
                auVar42 = vpcmpgtb_avx((undefined1  [16])0x0,auVar40);
                auVar46 = vpunpcklbw_avx(auVar40,auVar42);
                auVar45._8_8_ = 0;
                auVar45._0_8_ =
                     *(ulong *)((long)pvVar22 +
                               lVar36 * 8 +
                               (int)(((int)uVar37 >> 2) + (uVar25 - (uVar37 & 0xfffffffc))) * lVar20
                               );
                auVar45 = vpmovsxbw_avx(auVar45);
                auVar40 = vpunpckhbw_avx(auVar40,auVar42);
                auVar5 = vpmullw_avx(auVar45,auVar46);
                auVar42 = vpmulhw_avx(auVar45,auVar46);
                auVar6 = vpmullw_avx(auVar45,auVar40);
                auVar46 = vpmulhw_avx(auVar45,auVar40);
                auVar40 = vpunpcklwd_avx(auVar5,auVar42);
                auVar40 = vpaddd_avx(auVar40,auVar44._0_16_);
                auVar44 = ZEXT1664(auVar40);
                auVar45 = vpunpckhwd_avx(auVar5,auVar42);
                auVar45 = vpaddd_avx(auVar43._0_16_,auVar45);
                auVar43 = ZEXT1664(auVar45);
                auVar42 = vpunpcklwd_avx(auVar6,auVar46);
                auVar42 = vpaddd_avx(auVar41._0_16_,auVar42);
                auVar41 = ZEXT1664(auVar42);
                auVar46 = vpunpckhwd_avx(auVar6,auVar46);
                auVar46 = vpaddd_avx(auVar47._0_16_,auVar46);
                auVar47 = ZEXT1664(auVar46);
                pauVar26 = pauVar26 + 1;
                lVar36 = lVar36 + 1;
              } while (iVar33 != (int)lVar36);
              auVar40 = vpaddd_avx(auVar45,auVar40);
              auVar45 = vpaddd_avx(auVar46,auVar42);
            }
            auVar42 = vpshufd_avx(auVar40,0xee);
            auVar40 = vpaddd_avx(auVar40,auVar42);
            auVar42 = vpshufd_avx(auVar45,0xee);
            auVar45 = vpaddd_avx(auVar45,auVar42);
            auVar40 = vphaddd_avx(auVar40,auVar45);
            auVar40 = vpshufd_avx(auVar40,0xe8);
            *puVar27 = auVar40._0_8_;
            puVar27 = puVar27 + 1;
            uVar29 = uVar35 + 2;
            lVar36 = uVar35 + 3;
            uVar35 = uVar29;
          } while (lVar36 < (long)uVar23);
        }
        if ((int)uVar29 < (int)uVar1) {
          uVar37 = uVar25 + 3;
          if (-1 < (int)uVar25) {
            uVar37 = uVar25;
          }
          do {
            if ((int)(_h * iVar18) < 1) {
              auVar40 = (undefined1  [16])0x0;
            }
            else {
              auVar47 = ZEXT1664((undefined1  [16])0x0);
              lVar36 = 0;
              auVar41 = ZEXT1664((undefined1  [16])0x0);
              do {
                auVar42._8_8_ = 0;
                auVar42._0_8_ =
                     *(ulong *)((long)local_178.data +
                               lVar36 * 8 +
                               (ulong)(((uint)uVar29 & 1) + ((uint)(uVar29 >> 1) & 0x7fffffff)) *
                               local_178.cstep * local_178.elemsize);
                auVar40 = vpmovsxbw_avx(auVar42);
                auVar46._8_8_ = 0;
                auVar46._0_8_ =
                     *(ulong *)((long)pvVar22 +
                               lVar36 * 8 +
                               (int)(((int)uVar37 >> 2) + (uVar25 - (uVar37 & 0xfffffffc))) * lVar20
                               );
                auVar45 = vpmovsxbw_avx(auVar46);
                auVar42 = vpmullw_avx(auVar45,auVar40);
                auVar45 = vpmulhw_avx(auVar40,auVar45);
                auVar40 = vpunpcklwd_avx(auVar42,auVar45);
                auVar40 = vpaddd_avx(auVar41._0_16_,auVar40);
                auVar41 = ZEXT1664(auVar40);
                auVar45 = vpunpckhwd_avx(auVar42,auVar45);
                auVar45 = vpaddd_avx(auVar47._0_16_,auVar45);
                auVar47 = ZEXT1664(auVar45);
                lVar36 = lVar36 + 1;
              } while (iVar33 != (int)lVar36);
              auVar40 = vpaddd_avx(auVar45,auVar40);
            }
            auVar40 = vphaddd_avx(auVar40,auVar40);
            auVar40 = vphaddd_avx(auVar40,auVar40);
            *(int *)puVar27 = auVar40._0_4_;
            puVar27 = (undefined8 *)((long)puVar27 + 4);
            uVar38 = (uint)uVar29 + 1;
            uVar29 = (ulong)uVar38;
          } while (uVar38 != uVar1);
        }
        uVar24 = uVar24 + 1;
      } while ((long)uVar24 < (long)iVar2);
    }
    piVar17 = (int *)CONCAT44(local_178.refcount._4_4_,local_178.refcount._0_4_);
    if (piVar17 != (int *)0x0) {
      LOCK();
      *piVar17 = *piVar17 + -1;
      UNLOCK();
      if (*piVar17 == 0) {
        local_130 = kernel;
        if (local_178.allocator == (Allocator *)0x0) {
          if (local_178.data != (void *)0x0) {
            free(local_178.data);
          }
        }
        else {
          (*(local_178.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    return;
  }
  im2col_sgemm_pack8to1_int8_sse_xop(bottom_im2col,top_blob,kernel,opt);
  return;
}

Assistant:

static void im2col_sgemm_pack8to1_int8_sse(const Mat& bottom_im2col, Mat& top_blob, const Mat& kernel, const Option& opt)
{
#if !(__AVX512VNNI__ || __AVXVNNI__ || __AVX2__ || __XOP__)
#if NCNN_RUNTIME_CPU && NCNN_AVX512VNNI && __AVX512F__ && !__AVX512VNNI__
    if (ncnn::cpu_support_x86_avx512_vnni())
    {
        im2col_sgemm_pack8to1_int8_sse_avx512vnni(bottom_im2col, top_blob, kernel, opt);
        return;
    }
#endif

#if NCNN_RUNTIME_CPU && NCNN_AVXVNNI && __AVX2__ && !__AVXVNNI__
    if (ncnn::cpu_support_x86_avx_vnni())
    {
        im2col_sgemm_pack8to1_int8_sse_avxvnni(bottom_im2col, top_blob, kernel, opt);
        return;
    }
#endif

#if NCNN_RUNTIME_CPU && NCNN_AVX2 && __AVX__ && !__AVX2__
    if (ncnn::cpu_support_x86_avx2())
    {
        im2col_sgemm_pack8to1_int8_sse_avx2(bottom_im2col, top_blob, kernel, opt);
        return;
    }
#endif

#if NCNN_RUNTIME_CPU && NCNN_XOP && __SSE2__ && !__XOP__
    if (ncnn::cpu_support_x86_xop())
    {
        im2col_sgemm_pack8to1_int8_sse_xop(bottom_im2col, top_blob, kernel, opt);
        return;
    }
#endif
#endif

    // Mat bottom_im2col(size, maxk, inch, 8u, 8, opt.workspace_allocator);

    const int size = bottom_im2col.w;
    const int maxk = bottom_im2col.h;
    const int inch = bottom_im2col.c;

    const int outch = top_blob.c;

    // permute
    Mat tmp;
#if __AVX2__
    if (size >= 4)
        tmp.create(4 * maxk, inch, size / 4 + (size % 4) / 2 + size % 2, 8u, 8, opt.workspace_allocator);
    else if (size >= 2)
        tmp.create(2 * maxk, inch, size / 2 + size % 2, 8u, 8, opt.workspace_allocator);
    else
        tmp.create(maxk, inch, size, 8u, 8, opt.workspace_allocator);
#else
    if (size >= 2)
        tmp.create(2 * maxk, inch, size / 2 + size % 2, 8u, 8, opt.workspace_allocator);
    else
        tmp.create(maxk, inch, size, 8u, 8, opt.workspace_allocator);
#endif
    {
#if __AVX2__
        int remain_size_start = 0;
        int nn_size = size >> 2;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int ii = 0; ii < nn_size; ii++)
        {
            int i = remain_size_start + ii * 4;

            int64_t* tmpptr = tmp.channel(i / 4);

            for (int q = 0; q < inch; q++)
            {
                const int64_t* img0 = (const int64_t*)bottom_im2col.channel(q) + i;

                for (int k = 0; k < maxk; k++)
                {
                    __m256i _v = _mm256_loadu_si256((const __m256i*)img0);
                    _mm256_storeu_si256((__m256i*)tmpptr, _v);
                    tmpptr += 4;
                    img0 += size;
                }
            }
        }

        remain_size_start += nn_size << 2;
        nn_size = (size - remain_size_start) >> 1;
#else
        int remain_size_start = 0;
        int nn_size = (size - remain_size_start) >> 1;
#endif

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int ii = 0; ii < nn_size; ii++)
        {
            int i = remain_size_start + ii * 2;

#if __AVX2__
            int64_t* tmpptr = tmp.channel(i / 4 + (i % 4) / 2);
#else
            int64_t* tmpptr = tmp.channel(i / 2);
#endif

            for (int q = 0; q < inch; q++)
            {
                const int64_t* img0 = (const int64_t*)bottom_im2col.channel(q) + i;

                for (int k = 0; k < maxk; k++)
                {
                    __m128i _v = _mm_loadu_si128((const __m128i*)img0);
                    _mm_storeu_si128((__m128i*)tmpptr, _v);
                    tmpptr += 2;
                    img0 += size;
                }
            }
        }

        remain_size_start += nn_size << 1;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i = remain_size_start; i < size; i++)
        {
#if __AVX2__
            int64_t* tmpptr = tmp.channel(i / 4 + (i % 4) / 2 + i % 2);
#else
            int64_t* tmpptr = tmp.channel(i / 2 + i % 2);
#endif

            for (int q = 0; q < inch; q++)
            {
                const int64_t* img0 = (const int64_t*)bottom_im2col.channel(q) + i;

                for (int k = 0; k < maxk; k++)
                {
                    tmpptr[0] = img0[0];
                    tmpptr += 1;
                    img0 += size;
                }
            }
        }
    }

    int nn_outch = 0;
    int remain_outch_start = 0;

    nn_outch = outch >> 2;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int pp = 0; pp < nn_outch; pp++)
    {
        int p = pp * 4;

        int* outptr0 = top_blob.channel(p);
        int* outptr1 = top_blob.channel(p + 1);
        int* outptr2 = top_blob.channel(p + 2);
        int* outptr3 = top_blob.channel(p + 3);

        int i = 0;
#if __AVX2__
        for (; i + 3 < size; i += 4)
        {
            const signed char* tmpptr = tmp.channel(i / 4);
            const signed char* kptr0 = kernel.channel(p / 4);

            int nn = inch * maxk; // inch always > 0

            __m256i _sum00_11 = _mm256_setzero_si256();
            __m256i _sum10_01 = _mm256_setzero_si256();
            __m256i _sum02_13 = _mm256_setzero_si256();
            __m256i _sum12_03 = _mm256_setzero_si256();

            __m256i _sum04_15 = _mm256_setzero_si256();
            __m256i _sum14_05 = _mm256_setzero_si256();
            __m256i _sum06_17 = _mm256_setzero_si256();
            __m256i _sum16_07 = _mm256_setzero_si256();

            int j = 0;
            for (; j < nn; j++)
            {
                __m128i _val01 = _mm_loadu_si128((const __m128i*)tmpptr);
                __m256i _val01_16 = _mm256_cvtepi8_epi16(_val01);

                __m128i _w01 = _mm_loadu_si128((const __m128i*)kptr0);
                __m128i _w23 = _mm_loadu_si128((const __m128i*)(kptr0 + 16));
                __m256i _w01_16 = _mm256_cvtepi8_epi16(_w01);
                __m256i _w23_16 = _mm256_cvtepi8_epi16(_w23);

                __m256i _val10_16 = _mm256_permute4x64_epi64(_val01_16, 78);

#if __AVXVNNI__ || __AVX512VNNI__
                _sum00_11 = _mm256_dpwssd_epi32(_sum00_11, _val01_16, _w01_16);
                _sum10_01 = _mm256_dpwssd_epi32(_sum10_01, _val10_16, _w01_16);
                _sum02_13 = _mm256_dpwssd_epi32(_sum02_13, _val01_16, _w23_16);
                _sum12_03 = _mm256_dpwssd_epi32(_sum12_03, _val10_16, _w23_16);
#else
                __m256i _sl00_11 = _mm256_mullo_epi16(_val01_16, _w01_16);
                __m256i _sh00_11 = _mm256_mulhi_epi16(_val01_16, _w01_16);
                __m256i _sl10_01 = _mm256_mullo_epi16(_val10_16, _w01_16);
                __m256i _sh10_01 = _mm256_mulhi_epi16(_val10_16, _w01_16);
                __m256i _sl02_13 = _mm256_mullo_epi16(_val01_16, _w23_16);
                __m256i _sh02_13 = _mm256_mulhi_epi16(_val01_16, _w23_16);
                __m256i _sl12_03 = _mm256_mullo_epi16(_val10_16, _w23_16);
                __m256i _sh12_03 = _mm256_mulhi_epi16(_val10_16, _w23_16);

                _sum00_11 = _mm256_add_epi32(_sum00_11, _mm256_unpacklo_epi16(_sl00_11, _sh00_11));
                _sum10_01 = _mm256_add_epi32(_sum10_01, _mm256_unpacklo_epi16(_sl10_01, _sh10_01));
                _sum02_13 = _mm256_add_epi32(_sum02_13, _mm256_unpacklo_epi16(_sl02_13, _sh02_13));
                _sum12_03 = _mm256_add_epi32(_sum12_03, _mm256_unpacklo_epi16(_sl12_03, _sh12_03));
                _sum00_11 = _mm256_add_epi32(_sum00_11, _mm256_unpackhi_epi16(_sl00_11, _sh00_11));
                _sum10_01 = _mm256_add_epi32(_sum10_01, _mm256_unpackhi_epi16(_sl10_01, _sh10_01));
                _sum02_13 = _mm256_add_epi32(_sum02_13, _mm256_unpackhi_epi16(_sl02_13, _sh02_13));
                _sum12_03 = _mm256_add_epi32(_sum12_03, _mm256_unpackhi_epi16(_sl12_03, _sh12_03));
#endif

                __m128i _val23 = _mm_loadu_si128((const __m128i*)(tmpptr + 16));
                __m256i _val23_16 = _mm256_cvtepi8_epi16(_val23);
                __m256i _val32_16 = _mm256_permute4x64_epi64(_val23_16, 78);

#if __AVXVNNI__ || __AVX512VNNI__
                _sum04_15 = _mm256_dpwssd_epi32(_sum04_15, _val23_16, _w01_16);
                _sum14_05 = _mm256_dpwssd_epi32(_sum14_05, _val32_16, _w01_16);
                _sum06_17 = _mm256_dpwssd_epi32(_sum06_17, _val23_16, _w23_16);
                _sum16_07 = _mm256_dpwssd_epi32(_sum16_07, _val32_16, _w23_16);
#else
                __m256i _sl04_15 = _mm256_mullo_epi16(_val23_16, _w01_16);
                __m256i _sh04_15 = _mm256_mulhi_epi16(_val23_16, _w01_16);
                __m256i _sl14_05 = _mm256_mullo_epi16(_val32_16, _w01_16);
                __m256i _sh14_05 = _mm256_mulhi_epi16(_val32_16, _w01_16);
                __m256i _sl06_17 = _mm256_mullo_epi16(_val23_16, _w23_16);
                __m256i _sh06_17 = _mm256_mulhi_epi16(_val23_16, _w23_16);
                __m256i _sl16_07 = _mm256_mullo_epi16(_val32_16, _w23_16);
                __m256i _sh16_07 = _mm256_mulhi_epi16(_val32_16, _w23_16);

                _sum04_15 = _mm256_add_epi32(_sum04_15, _mm256_unpacklo_epi16(_sl04_15, _sh04_15));
                _sum14_05 = _mm256_add_epi32(_sum14_05, _mm256_unpacklo_epi16(_sl14_05, _sh14_05));
                _sum06_17 = _mm256_add_epi32(_sum06_17, _mm256_unpacklo_epi16(_sl06_17, _sh06_17));
                _sum16_07 = _mm256_add_epi32(_sum16_07, _mm256_unpacklo_epi16(_sl16_07, _sh16_07));
                _sum04_15 = _mm256_add_epi32(_sum04_15, _mm256_unpackhi_epi16(_sl04_15, _sh04_15));
                _sum14_05 = _mm256_add_epi32(_sum14_05, _mm256_unpackhi_epi16(_sl14_05, _sh14_05));
                _sum06_17 = _mm256_add_epi32(_sum06_17, _mm256_unpackhi_epi16(_sl06_17, _sh06_17));
                _sum16_07 = _mm256_add_epi32(_sum16_07, _mm256_unpackhi_epi16(_sl16_07, _sh16_07));
#endif

                tmpptr += 32;
                kptr0 += 32;
            }

            // transpose 4x8
            {
                __m256i _tmp0, _tmp1, _tmp2, _tmp3;
                _tmp0 = _mm256_unpacklo_epi32(_sum00_11, _sum10_01);
                _tmp1 = _mm256_unpacklo_epi32(_sum02_13, _sum12_03);
                _tmp2 = _mm256_unpackhi_epi32(_sum00_11, _sum10_01);
                _tmp3 = _mm256_unpackhi_epi32(_sum02_13, _sum12_03);
                _sum00_11 = _mm256_unpacklo_epi64(_tmp0, _tmp1);
                _sum10_01 = _mm256_unpackhi_epi64(_tmp0, _tmp1);
                _sum02_13 = _mm256_unpacklo_epi64(_tmp2, _tmp3);
                _sum12_03 = _mm256_unpackhi_epi64(_tmp2, _tmp3);
            }
            {
                __m256i _tmp0, _tmp1, _tmp2, _tmp3;
                _tmp0 = _mm256_unpacklo_epi32(_sum04_15, _sum14_05);
                _tmp1 = _mm256_unpacklo_epi32(_sum06_17, _sum16_07);
                _tmp2 = _mm256_unpackhi_epi32(_sum04_15, _sum14_05);
                _tmp3 = _mm256_unpackhi_epi32(_sum06_17, _sum16_07);
                _sum04_15 = _mm256_unpacklo_epi64(_tmp0, _tmp1);
                _sum14_05 = _mm256_unpackhi_epi64(_tmp0, _tmp1);
                _sum06_17 = _mm256_unpacklo_epi64(_tmp2, _tmp3);
                _sum16_07 = _mm256_unpackhi_epi64(_tmp2, _tmp3);
            }

            _sum00_11 = _mm256_add_epi32(_sum00_11, _sum10_01);
            _sum02_13 = _mm256_add_epi32(_sum02_13, _sum12_03);
            _sum00_11 = _mm256_add_epi32(_sum00_11, _sum02_13);

            _sum04_15 = _mm256_add_epi32(_sum04_15, _sum14_05);
            _sum06_17 = _mm256_add_epi32(_sum06_17, _sum16_07);
            _sum04_15 = _mm256_add_epi32(_sum04_15, _sum06_17);

            __m256i _perm_mask = _mm256_set_epi32(6, 3, 4, 1, 7, 2, 5, 0);
            _sum00_11 = _mm256_permutevar8x32_epi32(_sum00_11, _perm_mask);
            _sum04_15 = _mm256_permutevar8x32_epi32(_sum04_15, _perm_mask);

            int sum[16];
            _mm256_storeu_si256((__m256i*)sum, _sum00_11);
            _mm256_storeu_si256((__m256i*)(sum + 8), _sum04_15);

            outptr0[0] = sum[0];
            outptr1[0] = sum[1];
            outptr2[0] = sum[2];
            outptr3[0] = sum[3];
            outptr0[1] = sum[4];
            outptr1[1] = sum[5];
            outptr2[1] = sum[6];
            outptr3[1] = sum[7];
            outptr0[2] = sum[8];
            outptr1[2] = sum[9];
            outptr2[2] = sum[10];
            outptr3[2] = sum[11];
            outptr0[3] = sum[12];
            outptr1[3] = sum[13];
            outptr2[3] = sum[14];
            outptr3[3] = sum[15];
            outptr0 += 4;
            outptr1 += 4;
            outptr2 += 4;
            outptr3 += 4;
        }
#endif
        for (; i + 1 < size; i += 2)
        {
#if __AVX2__
            const signed char* tmpptr = tmp.channel(i / 4 + (i % 4) / 2);
#else
            const signed char* tmpptr = tmp.channel(i / 2);
#endif
            const signed char* kptr0 = kernel.channel(p / 4);

            int nn = inch * maxk; // inch always > 0

#if __AVX2__
            __m256i _sum00_11 = _mm256_setzero_si256();
            __m256i _sum10_01 = _mm256_setzero_si256();
            __m256i _sum02_13 = _mm256_setzero_si256();
            __m256i _sum12_03 = _mm256_setzero_si256();
#else
            __m128i _sum00 = _mm_setzero_si128();
            __m128i _sum01 = _mm_setzero_si128();
            __m128i _sum02 = _mm_setzero_si128();
            __m128i _sum03 = _mm_setzero_si128();
            __m128i _sum10 = _mm_setzero_si128();
            __m128i _sum11 = _mm_setzero_si128();
            __m128i _sum12 = _mm_setzero_si128();
            __m128i _sum13 = _mm_setzero_si128();
#endif

            int j = 0;
            for (; j < nn; j++)
            {
#if __AVX2__
                __m128i _val01 = _mm_loadu_si128((const __m128i*)tmpptr);
                __m256i _val01_16 = _mm256_cvtepi8_epi16(_val01);

                __m128i _w01 = _mm_loadu_si128((const __m128i*)kptr0);
                __m128i _w23 = _mm_loadu_si128((const __m128i*)(kptr0 + 16));
                __m256i _w01_16 = _mm256_cvtepi8_epi16(_w01);
                __m256i _w23_16 = _mm256_cvtepi8_epi16(_w23);

                __m256i _val10_16 = _mm256_permute4x64_epi64(_val01_16, 78);

#if __AVXVNNI__ || __AVX512VNNI__
                _sum00_11 = _mm256_dpwssd_epi32(_sum00_11, _val01_16, _w01_16);
                _sum10_01 = _mm256_dpwssd_epi32(_sum10_01, _val10_16, _w01_16);
                _sum02_13 = _mm256_dpwssd_epi32(_sum02_13, _val01_16, _w23_16);
                _sum12_03 = _mm256_dpwssd_epi32(_sum12_03, _val10_16, _w23_16);
#else
                __m256i _sl00_11 = _mm256_mullo_epi16(_val01_16, _w01_16);
                __m256i _sh00_11 = _mm256_mulhi_epi16(_val01_16, _w01_16);
                __m256i _sl10_01 = _mm256_mullo_epi16(_val10_16, _w01_16);
                __m256i _sh10_01 = _mm256_mulhi_epi16(_val10_16, _w01_16);
                __m256i _sl02_13 = _mm256_mullo_epi16(_val01_16, _w23_16);
                __m256i _sh02_13 = _mm256_mulhi_epi16(_val01_16, _w23_16);
                __m256i _sl12_03 = _mm256_mullo_epi16(_val10_16, _w23_16);
                __m256i _sh12_03 = _mm256_mulhi_epi16(_val10_16, _w23_16);

                _sum00_11 = _mm256_add_epi32(_sum00_11, _mm256_unpacklo_epi16(_sl00_11, _sh00_11));
                _sum10_01 = _mm256_add_epi32(_sum10_01, _mm256_unpacklo_epi16(_sl10_01, _sh10_01));
                _sum02_13 = _mm256_add_epi32(_sum02_13, _mm256_unpacklo_epi16(_sl02_13, _sh02_13));
                _sum12_03 = _mm256_add_epi32(_sum12_03, _mm256_unpacklo_epi16(_sl12_03, _sh12_03));
                _sum00_11 = _mm256_add_epi32(_sum00_11, _mm256_unpackhi_epi16(_sl00_11, _sh00_11));
                _sum10_01 = _mm256_add_epi32(_sum10_01, _mm256_unpackhi_epi16(_sl10_01, _sh10_01));
                _sum02_13 = _mm256_add_epi32(_sum02_13, _mm256_unpackhi_epi16(_sl02_13, _sh02_13));
                _sum12_03 = _mm256_add_epi32(_sum12_03, _mm256_unpackhi_epi16(_sl12_03, _sh12_03));
#endif
#else
                __m128i _val01 = _mm_loadu_si128((const __m128i*)tmpptr);
                __m128i _extval01 = _mm_cmpgt_epi8(_mm_setzero_si128(), _val01);
                __m128i _val0 = _mm_unpacklo_epi8(_val01, _extval01);
                __m128i _val1 = _mm_unpackhi_epi8(_val01, _extval01);

                __m128i _w01 = _mm_loadu_si128((const __m128i*)kptr0);
                __m128i _w23 = _mm_loadu_si128((const __m128i*)(kptr0 + 16));
                __m128i _extw01 = _mm_cmpgt_epi8(_mm_setzero_si128(), _w01);
                __m128i _extw23 = _mm_cmpgt_epi8(_mm_setzero_si128(), _w23);
                __m128i _w0 = _mm_unpacklo_epi8(_w01, _extw01);
                __m128i _w1 = _mm_unpackhi_epi8(_w01, _extw01);
                __m128i _w2 = _mm_unpacklo_epi8(_w23, _extw23);
                __m128i _w3 = _mm_unpackhi_epi8(_w23, _extw23);

#if __XOP__
                _sum00 = _mm_maddd_epi16(_val0, _w0, _sum00);
                _sum01 = _mm_maddd_epi16(_val0, _w1, _sum01);
                _sum02 = _mm_maddd_epi16(_val0, _w2, _sum02);
                _sum03 = _mm_maddd_epi16(_val0, _w3, _sum03);
                _sum10 = _mm_maddd_epi16(_val1, _w0, _sum10);
                _sum11 = _mm_maddd_epi16(_val1, _w1, _sum11);
                _sum12 = _mm_maddd_epi16(_val1, _w2, _sum12);
                _sum13 = _mm_maddd_epi16(_val1, _w3, _sum13);
#else
                __m128i _sl00 = _mm_mullo_epi16(_val0, _w0);
                __m128i _sh00 = _mm_mulhi_epi16(_val0, _w0);
                __m128i _sl01 = _mm_mullo_epi16(_val0, _w1);
                __m128i _sh01 = _mm_mulhi_epi16(_val0, _w1);
                __m128i _sl02 = _mm_mullo_epi16(_val0, _w2);
                __m128i _sh02 = _mm_mulhi_epi16(_val0, _w2);
                __m128i _sl03 = _mm_mullo_epi16(_val0, _w3);
                __m128i _sh03 = _mm_mulhi_epi16(_val0, _w3);
                __m128i _sl10 = _mm_mullo_epi16(_val1, _w0);
                __m128i _sh10 = _mm_mulhi_epi16(_val1, _w0);
                __m128i _sl11 = _mm_mullo_epi16(_val1, _w1);
                __m128i _sh11 = _mm_mulhi_epi16(_val1, _w1);
                __m128i _sl12 = _mm_mullo_epi16(_val1, _w2);
                __m128i _sh12 = _mm_mulhi_epi16(_val1, _w2);
                __m128i _sl13 = _mm_mullo_epi16(_val1, _w3);
                __m128i _sh13 = _mm_mulhi_epi16(_val1, _w3);

                _sum00 = _mm_add_epi32(_sum00, _mm_unpacklo_epi16(_sl00, _sh00));
                _sum01 = _mm_add_epi32(_sum01, _mm_unpacklo_epi16(_sl01, _sh01));
                _sum02 = _mm_add_epi32(_sum02, _mm_unpacklo_epi16(_sl02, _sh02));
                _sum03 = _mm_add_epi32(_sum03, _mm_unpacklo_epi16(_sl03, _sh03));
                _sum00 = _mm_add_epi32(_sum00, _mm_unpackhi_epi16(_sl00, _sh00));
                _sum01 = _mm_add_epi32(_sum01, _mm_unpackhi_epi16(_sl01, _sh01));
                _sum02 = _mm_add_epi32(_sum02, _mm_unpackhi_epi16(_sl02, _sh02));
                _sum03 = _mm_add_epi32(_sum03, _mm_unpackhi_epi16(_sl03, _sh03));
                _sum10 = _mm_add_epi32(_sum10, _mm_unpacklo_epi16(_sl10, _sh10));
                _sum11 = _mm_add_epi32(_sum11, _mm_unpacklo_epi16(_sl11, _sh11));
                _sum12 = _mm_add_epi32(_sum12, _mm_unpacklo_epi16(_sl12, _sh12));
                _sum13 = _mm_add_epi32(_sum13, _mm_unpacklo_epi16(_sl13, _sh13));
                _sum10 = _mm_add_epi32(_sum10, _mm_unpackhi_epi16(_sl10, _sh10));
                _sum11 = _mm_add_epi32(_sum11, _mm_unpackhi_epi16(_sl11, _sh11));
                _sum12 = _mm_add_epi32(_sum12, _mm_unpackhi_epi16(_sl12, _sh12));
                _sum13 = _mm_add_epi32(_sum13, _mm_unpackhi_epi16(_sl13, _sh13));
#endif
#endif

                tmpptr += 16;
                kptr0 += 32;
            }

#if __AVX2__
            // transpose 4x8
            {
                __m256i _tmp0, _tmp1, _tmp2, _tmp3;
                _tmp0 = _mm256_unpacklo_epi32(_sum00_11, _sum10_01);
                _tmp1 = _mm256_unpacklo_epi32(_sum02_13, _sum12_03);
                _tmp2 = _mm256_unpackhi_epi32(_sum00_11, _sum10_01);
                _tmp3 = _mm256_unpackhi_epi32(_sum02_13, _sum12_03);
                _sum00_11 = _mm256_unpacklo_epi64(_tmp0, _tmp1);
                _sum10_01 = _mm256_unpackhi_epi64(_tmp0, _tmp1);
                _sum02_13 = _mm256_unpacklo_epi64(_tmp2, _tmp3);
                _sum12_03 = _mm256_unpackhi_epi64(_tmp2, _tmp3);
            }

            _sum00_11 = _mm256_add_epi32(_sum00_11, _sum10_01);
            _sum02_13 = _mm256_add_epi32(_sum02_13, _sum12_03);
            _sum00_11 = _mm256_add_epi32(_sum00_11, _sum02_13);

            __m256i _perm_mask = _mm256_set_epi32(6, 3, 4, 1, 7, 2, 5, 0);
            _sum00_11 = _mm256_permutevar8x32_epi32(_sum00_11, _perm_mask);

            int sum[8];
            _mm256_storeu_si256((__m256i*)sum, _sum00_11);
#else
            // transpose 4x4
            {
                __m128i _tmp0, _tmp1, _tmp2, _tmp3;
                _tmp0 = _mm_unpacklo_epi32(_sum00, _sum01);
                _tmp1 = _mm_unpacklo_epi32(_sum02, _sum03);
                _tmp2 = _mm_unpackhi_epi32(_sum00, _sum01);
                _tmp3 = _mm_unpackhi_epi32(_sum02, _sum03);
                _sum00 = _mm_unpacklo_epi64(_tmp0, _tmp1);
                _sum01 = _mm_unpackhi_epi64(_tmp0, _tmp1);
                _sum02 = _mm_unpacklo_epi64(_tmp2, _tmp3);
                _sum03 = _mm_unpackhi_epi64(_tmp2, _tmp3);
            }
            {
                __m128i _tmp0, _tmp1, _tmp2, _tmp3;
                _tmp0 = _mm_unpacklo_epi32(_sum10, _sum11);
                _tmp1 = _mm_unpacklo_epi32(_sum12, _sum13);
                _tmp2 = _mm_unpackhi_epi32(_sum10, _sum11);
                _tmp3 = _mm_unpackhi_epi32(_sum12, _sum13);
                _sum10 = _mm_unpacklo_epi64(_tmp0, _tmp1);
                _sum11 = _mm_unpackhi_epi64(_tmp0, _tmp1);
                _sum12 = _mm_unpacklo_epi64(_tmp2, _tmp3);
                _sum13 = _mm_unpackhi_epi64(_tmp2, _tmp3);
            }

            _sum00 = _mm_add_epi32(_sum00, _sum01);
            _sum02 = _mm_add_epi32(_sum02, _sum03);
            _sum10 = _mm_add_epi32(_sum10, _sum11);
            _sum12 = _mm_add_epi32(_sum12, _sum13);

            _sum00 = _mm_add_epi32(_sum00, _sum02);
            _sum10 = _mm_add_epi32(_sum10, _sum12);

            int sum[8];
            _mm_storeu_si128((__m128i*)sum, _sum00);
            _mm_storeu_si128((__m128i*)(sum + 4), _sum10);
#endif

            outptr0[0] = sum[0];
            outptr1[0] = sum[1];
            outptr2[0] = sum[2];
            outptr3[0] = sum[3];
            outptr0[1] = sum[4];
            outptr1[1] = sum[5];
            outptr2[1] = sum[6];
            outptr3[1] = sum[7];
            outptr0 += 2;
            outptr1 += 2;
            outptr2 += 2;
            outptr3 += 2;
        }
        for (; i < size; i++)
        {
#if __AVX2__
            const signed char* tmpptr = tmp.channel(i / 4 + (i % 4) / 2 + i % 2);
#else
            const signed char* tmpptr = tmp.channel(i / 2 + i % 2);
#endif
            const signed char* kptr0 = kernel.channel(p / 4);

            int nn = inch * maxk; // inch always > 0

#if __AVX2__
            __m256i _sum0_1 = _mm256_setzero_si256();
            __m256i _sum2_3 = _mm256_setzero_si256();
#else
            __m128i _sum0 = _mm_setzero_si128();
            __m128i _sum1 = _mm_setzero_si128();
            __m128i _sum2 = _mm_setzero_si128();
            __m128i _sum3 = _mm_setzero_si128();
#endif

            int j = 0;
            for (; j < nn; j++)
            {
#if __AVX2__
                __m128i _val = _mm_loadl_epi64((const __m128i*)tmpptr);
                _val = _mm_cvtepi8_epi16(_val);

                __m128i _w01 = _mm_loadu_si128((const __m128i*)kptr0);
                __m128i _w23 = _mm_loadu_si128((const __m128i*)(kptr0 + 16));
                __m256i _w01_16 = _mm256_cvtepi8_epi16(_w01);
                __m256i _w23_16 = _mm256_cvtepi8_epi16(_w23);

                __m256i _valval = _mm256_inserti128_si256(_mm256_castsi128_si256(_val), _val, 1);

#if __AVXVNNI__ || __AVX512VNNI__
                _sum0_1 = _mm256_dpwssd_epi32(_sum0_1, _valval, _w01_16);
                _sum2_3 = _mm256_dpwssd_epi32(_sum2_3, _valval, _w23_16);
#else
                __m256i _sl0_1 = _mm256_mullo_epi16(_valval, _w01_16);
                __m256i _sh0_1 = _mm256_mulhi_epi16(_valval, _w01_16);
                __m256i _sl2_3 = _mm256_mullo_epi16(_valval, _w23_16);
                __m256i _sh2_3 = _mm256_mulhi_epi16(_valval, _w23_16);

                _sum0_1 = _mm256_add_epi32(_sum0_1, _mm256_unpacklo_epi16(_sl0_1, _sh0_1));
                _sum2_3 = _mm256_add_epi32(_sum2_3, _mm256_unpacklo_epi16(_sl2_3, _sh2_3));
                _sum0_1 = _mm256_add_epi32(_sum0_1, _mm256_unpackhi_epi16(_sl0_1, _sh0_1));
                _sum2_3 = _mm256_add_epi32(_sum2_3, _mm256_unpackhi_epi16(_sl2_3, _sh2_3));
#endif
#else
                __m128i _val = _mm_loadl_epi64((const __m128i*)tmpptr);
#if __SSE4_1__
                _val = _mm_cvtepi8_epi16(_val);
#else
                _val = _mm_unpacklo_epi8(_val, _mm_cmpgt_epi8(_mm_setzero_si128(), _val));
#endif

                __m128i _w01 = _mm_loadu_si128((const __m128i*)kptr0);
                __m128i _w23 = _mm_loadu_si128((const __m128i*)(kptr0 + 16));
                __m128i _extw01 = _mm_cmpgt_epi8(_mm_setzero_si128(), _w01);
                __m128i _extw23 = _mm_cmpgt_epi8(_mm_setzero_si128(), _w23);
                __m128i _w0 = _mm_unpacklo_epi8(_w01, _extw01);
                __m128i _w1 = _mm_unpackhi_epi8(_w01, _extw01);
                __m128i _w2 = _mm_unpacklo_epi8(_w23, _extw23);
                __m128i _w3 = _mm_unpackhi_epi8(_w23, _extw23);

#if __XOP__
                _sum0 = _mm_maddd_epi16(_val, _w0, _sum0);
                _sum1 = _mm_maddd_epi16(_val, _w1, _sum1);
                _sum2 = _mm_maddd_epi16(_val, _w2, _sum2);
                _sum3 = _mm_maddd_epi16(_val, _w3, _sum3);
#else
                __m128i _sl0 = _mm_mullo_epi16(_val, _w0);
                __m128i _sh0 = _mm_mulhi_epi16(_val, _w0);
                __m128i _sl1 = _mm_mullo_epi16(_val, _w1);
                __m128i _sh1 = _mm_mulhi_epi16(_val, _w1);
                __m128i _sl2 = _mm_mullo_epi16(_val, _w2);
                __m128i _sh2 = _mm_mulhi_epi16(_val, _w2);
                __m128i _sl3 = _mm_mullo_epi16(_val, _w3);
                __m128i _sh3 = _mm_mulhi_epi16(_val, _w3);

                _sum0 = _mm_add_epi32(_sum0, _mm_unpacklo_epi16(_sl0, _sh0));
                _sum1 = _mm_add_epi32(_sum1, _mm_unpacklo_epi16(_sl1, _sh1));
                _sum2 = _mm_add_epi32(_sum2, _mm_unpacklo_epi16(_sl2, _sh2));
                _sum3 = _mm_add_epi32(_sum3, _mm_unpacklo_epi16(_sl3, _sh3));
                _sum0 = _mm_add_epi32(_sum0, _mm_unpackhi_epi16(_sl0, _sh0));
                _sum1 = _mm_add_epi32(_sum1, _mm_unpackhi_epi16(_sl1, _sh1));
                _sum2 = _mm_add_epi32(_sum2, _mm_unpackhi_epi16(_sl2, _sh2));
                _sum3 = _mm_add_epi32(_sum3, _mm_unpackhi_epi16(_sl3, _sh3));
#endif
#endif

                tmpptr += 8;
                kptr0 += 32;
            }

#if __AVX2__
            __m128i _sum0 = _mm256_extracti128_si256(_sum0_1, 0);
            __m128i _sum1 = _mm256_extracti128_si256(_sum0_1, 1);
            __m128i _sum2 = _mm256_extracti128_si256(_sum2_3, 0);
            __m128i _sum3 = _mm256_extracti128_si256(_sum2_3, 1);
#endif

            // transpose 4x4
            {
                __m128i _tmp0, _tmp1, _tmp2, _tmp3;
                _tmp0 = _mm_unpacklo_epi32(_sum0, _sum1);
                _tmp1 = _mm_unpacklo_epi32(_sum2, _sum3);
                _tmp2 = _mm_unpackhi_epi32(_sum0, _sum1);
                _tmp3 = _mm_unpackhi_epi32(_sum2, _sum3);
                _sum0 = _mm_unpacklo_epi64(_tmp0, _tmp1);
                _sum1 = _mm_unpackhi_epi64(_tmp0, _tmp1);
                _sum2 = _mm_unpacklo_epi64(_tmp2, _tmp3);
                _sum3 = _mm_unpackhi_epi64(_tmp2, _tmp3);
            }

            _sum0 = _mm_add_epi32(_sum0, _sum1);
            _sum2 = _mm_add_epi32(_sum2, _sum3);

            _sum0 = _mm_add_epi32(_sum0, _sum2);

            int sum[4];
            _mm_storeu_si128((__m128i*)sum, _sum0);

            outptr0[0] = sum[0];
            outptr1[0] = sum[1];
            outptr2[0] = sum[2];
            outptr3[0] = sum[3];
            outptr0 += 1;
            outptr1 += 1;
            outptr2 += 1;
            outptr3 += 1;
        }
    }

    remain_outch_start += nn_outch << 2;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p = remain_outch_start; p < outch; p++)
    {
        int* outptr0 = top_blob.channel(p);

        int i = 0;
#if __AVX2__
        for (; i + 3 < size; i += 4)
        {
            const signed char* tmpptr = tmp.channel(i / 4);
            const signed char* kptr0 = kernel.channel(p / 4 + p % 4);

            int nn = inch * maxk; // inch always > 0

            __m256i _sum0_2 = _mm256_setzero_si256();
            __m256i _sum1_3 = _mm256_setzero_si256();
            __m256i _sum4_6 = _mm256_setzero_si256();
            __m256i _sum5_7 = _mm256_setzero_si256();

            int j = 0;
            for (; j < nn; j++)
            {
                __m128i _val01 = _mm_loadu_si128((const __m128i*)tmpptr);
                __m128i _val23 = _mm_loadu_si128((const __m128i*)(tmpptr + 16));
                __m256i _val01_16 = _mm256_cvtepi8_epi16(_val01);
                __m256i _val23_16 = _mm256_cvtepi8_epi16(_val23);

                __m128i _w01 = _mm_loadl_epi64((const __m128i*)kptr0);
                __m256i _w01_16 = _mm256_cvtepi8_epi16(_w01);
                _w01_16 = _mm256_permute4x64_epi64(_w01_16, _MM_SHUFFLE(1, 0, 1, 0));

                __m256i _sl00_10 = _mm256_mullo_epi16(_val01_16, _w01_16);
                __m256i _sh00_10 = _mm256_mulhi_epi16(_val01_16, _w01_16);
                __m256i _sl20_30 = _mm256_mullo_epi16(_val23_16, _w01_16);
                __m256i _sh20_30 = _mm256_mulhi_epi16(_val23_16, _w01_16);

                _sum0_2 = _mm256_add_epi32(_sum0_2, _mm256_unpacklo_epi16(_sl00_10, _sh00_10));
                _sum1_3 = _mm256_add_epi32(_sum1_3, _mm256_unpackhi_epi16(_sl00_10, _sh00_10));
                _sum4_6 = _mm256_add_epi32(_sum4_6, _mm256_unpacklo_epi16(_sl20_30, _sh20_30));
                _sum5_7 = _mm256_add_epi32(_sum5_7, _mm256_unpackhi_epi16(_sl20_30, _sh20_30));

                tmpptr += 32;
                kptr0 += 8;
            }

            _sum0_2 = _mm256_add_epi32(_sum0_2, _sum1_3);
            _sum4_6 = _mm256_add_epi32(_sum4_6, _sum5_7);
            __m128i _sum0 = _mm256_extracti128_si256(_sum0_2, 0);
            __m128i _sum2 = _mm256_extracti128_si256(_sum0_2, 1);
            __m128i _sum4 = _mm256_extracti128_si256(_sum4_6, 0);
            __m128i _sum6 = _mm256_extracti128_si256(_sum4_6, 1);

            outptr0[0] = _mm_reduce_add_epi32(_sum0);
            outptr0[1] = _mm_reduce_add_epi32(_sum2);
            outptr0[2] = _mm_reduce_add_epi32(_sum4);
            outptr0[3] = _mm_reduce_add_epi32(_sum6);
            outptr0 += 4;
        }
#endif
        for (; i + 1 < size; i += 2)
        {
#if __AVX2__
            const signed char* tmpptr = tmp.channel(i / 4 + (i % 4) / 2);
#else
            const signed char* tmpptr = tmp.channel(i / 2);
#endif
            const signed char* kptr0 = kernel.channel(p / 4 + p % 4);

            int nn = inch * maxk; // inch always > 0

#if __AVX2__
            __m256i _sum0_2 = _mm256_setzero_si256();
            __m256i _sum1_3 = _mm256_setzero_si256();
#else
            __m128i _sum0 = _mm_setzero_si128();
            __m128i _sum1 = _mm_setzero_si128();
            __m128i _sum2 = _mm_setzero_si128();
            __m128i _sum3 = _mm_setzero_si128();
#endif

            int j = 0;
            for (; j < nn; j++)
            {
#if __AVX2__
                __m128i _val01 = _mm_loadu_si128((const __m128i*)tmpptr);
                __m256i _val01_16 = _mm256_cvtepi8_epi16(_val01);

                __m128i _w01 = _mm_loadl_epi64((const __m128i*)kptr0);
                __m256i _w01_16 = _mm256_cvtepi8_epi16(_w01);
                _w01_16 = _mm256_permute4x64_epi64(_w01_16, _MM_SHUFFLE(1, 0, 1, 0));

                __m256i _sl00_10 = _mm256_mullo_epi16(_val01_16, _w01_16);
                __m256i _sh00_10 = _mm256_mulhi_epi16(_val01_16, _w01_16);

                _sum0_2 = _mm256_add_epi32(_sum0_2, _mm256_unpacklo_epi16(_sl00_10, _sh00_10));
                _sum1_3 = _mm256_add_epi32(_sum1_3, _mm256_unpackhi_epi16(_sl00_10, _sh00_10));
#else
                __m128i _val01 = _mm_loadu_si128((const __m128i*)tmpptr);
                __m128i _extval01 = _mm_cmpgt_epi8(_mm_setzero_si128(), _val01);
                __m128i _val0 = _mm_unpacklo_epi8(_val01, _extval01);
                __m128i _val1 = _mm_unpackhi_epi8(_val01, _extval01);

                __m128i _w01 = _mm_loadl_epi64((const __m128i*)kptr0);
#if __SSE4_1__
                __m128i _w0 = _mm_cvtepi8_epi16(_w01);
#else
                __m128i _extw01 = _mm_cmpgt_epi8(_mm_setzero_si128(), _w01);
                __m128i _w0 = _mm_unpacklo_epi8(_w01, _extw01);
#endif

                __m128i _sl00 = _mm_mullo_epi16(_val0, _w0);
                __m128i _sh00 = _mm_mulhi_epi16(_val0, _w0);
                __m128i _sl10 = _mm_mullo_epi16(_val1, _w0);
                __m128i _sh10 = _mm_mulhi_epi16(_val1, _w0);

                _sum0 = _mm_add_epi32(_sum0, _mm_unpacklo_epi16(_sl00, _sh00));
                _sum1 = _mm_add_epi32(_sum1, _mm_unpackhi_epi16(_sl00, _sh00));
                _sum2 = _mm_add_epi32(_sum2, _mm_unpacklo_epi16(_sl10, _sh10));
                _sum3 = _mm_add_epi32(_sum3, _mm_unpackhi_epi16(_sl10, _sh10));
#endif

                tmpptr += 16;
                kptr0 += 8;
            }

#if __AVX2__
            _sum0_2 = _mm256_add_epi32(_sum0_2, _sum1_3);
            __m128i _sum0 = _mm256_extracti128_si256(_sum0_2, 0);
            __m128i _sum2 = _mm256_extracti128_si256(_sum0_2, 1);
#else
            _sum0 = _mm_add_epi32(_sum0, _sum1);
            _sum2 = _mm_add_epi32(_sum2, _sum3);
#endif

            outptr0[0] = _mm_reduce_add_epi32(_sum0);
            outptr0[1] = _mm_reduce_add_epi32(_sum2);
            outptr0 += 2;
        }
        for (; i < size; i++)
        {
#if __AVX2__
            const signed char* tmpptr = tmp.channel(i / 4 + (i % 4) / 2 + i % 2);
#else
            const signed char* tmpptr = tmp.channel(i / 2 + i % 2);
#endif
            const signed char* kptr0 = kernel.channel(p / 4 + p % 4);

            int nn = inch * maxk; // inch always > 0

            __m128i _sum0 = _mm_setzero_si128();
            __m128i _sum1 = _mm_setzero_si128();

            int j = 0;
            for (; j < nn; j++)
            {
                __m128i _val01 = _mm_loadl_epi64((const __m128i*)tmpptr);
#if __SSE4_1__
                __m128i _val0 = _mm_cvtepi8_epi16(_val01);
#else
                __m128i _extval01 = _mm_cmpgt_epi8(_mm_setzero_si128(), _val01);
                __m128i _val0 = _mm_unpacklo_epi8(_val01, _extval01);
#endif

                __m128i _w01 = _mm_loadl_epi64((const __m128i*)kptr0);
#if __SSE4_1__
                __m128i _w0 = _mm_cvtepi8_epi16(_w01);
#else
                __m128i _extw01 = _mm_cmpgt_epi8(_mm_setzero_si128(), _w01);
                __m128i _w0 = _mm_unpacklo_epi8(_w01, _extw01);
#endif

                __m128i _sl00 = _mm_mullo_epi16(_val0, _w0);
                __m128i _sh00 = _mm_mulhi_epi16(_val0, _w0);

                _sum0 = _mm_add_epi32(_sum0, _mm_unpacklo_epi16(_sl00, _sh00));
                _sum1 = _mm_add_epi32(_sum1, _mm_unpackhi_epi16(_sl00, _sh00));

                tmpptr += 8;
                kptr0 += 8;
            }

            _sum0 = _mm_add_epi32(_sum0, _sum1);

            outptr0[0] = _mm_reduce_add_epi32(_sum0);
            outptr0 += 1;
        }
    }
}